

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkGear.cpp
# Opt level: O1

void __thiscall chrono::ChLinkGear::UpdateTime(ChLinkGear *this,double mytime)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  ChBodyFrame *pCVar31;
  double dVar32;
  double dVar33;
  undefined8 uVar34;
  bool bVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  bool bVar41;
  ChMatrix33<double> *pCVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  double dVar47;
  double dVar48;
  double dVar49;
  char cVar50;
  double *pdVar51;
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  double dVar66;
  double dVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar63;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  double dVar64;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  double dVar65;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  double dVar120;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  double dVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  double m21;
  double m01;
  double m10;
  double m12;
  double m20;
  double m02;
  ChMatrix33<double> mrotma;
  ChMatrix33<double> ma1;
  Coordsys newmarkpos;
  ChMatrix33<double> marot_beta;
  undefined1 local_438 [16];
  undefined1 local_418 [16];
  double local_3d8;
  ChVector<double> local_3b0;
  double local_398;
  undefined8 uStack_390;
  undefined1 local_388 [16];
  double local_370;
  double local_368;
  undefined8 uStack_360;
  double local_358;
  undefined8 uStack_350;
  ChMatrix33<double> *local_348;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  double local_338;
  undefined4 uStack_330;
  undefined4 uStack_32c;
  ChVector<double> *local_320;
  double local_318;
  double local_310;
  double local_308;
  undefined8 uStack_300;
  undefined1 local_2f8 [16];
  double local_2e0;
  double local_2d8;
  undefined8 uStack_2d0;
  ChVector<double> local_2c8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  ChVector<double> local_270;
  ChMatrix33<double> local_258;
  double local_210;
  double local_208;
  ChVector<double> *local_200;
  ChMatrix33<double> *local_1f8;
  ulong local_1f0;
  double local_1e8;
  ulong local_1e0;
  double local_1d8;
  double local_1d0;
  Coordsys local_1c8;
  ChFrame<double> local_188;
  ChFrame<double> local_100;
  ChMatrix33<double> local_78;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  ChLink::UpdateTime((ChLink *)this,mytime);
  local_1c8.pos.m_data[2] = 0.0;
  local_1c8.pos.m_data[0] = 0.0;
  local_1c8.pos.m_data[1] = 0.0;
  local_1c8.rot.m_data[0] = 1.0;
  local_1c8.rot.m_data[1] = 0.0;
  local_1c8.rot.m_data[2] = 0.0;
  local_1c8.rot.m_data[3] = 0.0;
  local_100._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_100.coord.pos.m_data[0] = 0.0;
  local_100.coord.pos.m_data[1] = 0.0;
  local_100.coord.pos.m_data[2] = 0.0;
  local_188._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_188.coord.pos.m_data[0] = 0.0;
  local_188.coord.pos.m_data[1] = 0.0;
  local_188.coord.pos.m_data[2] = 0.0;
  local_188.coord.rot.m_data[0] = 1.0;
  local_188.coord.rot.m_data[1] = 0.0;
  local_188.coord.rot.m_data[2] = 0.0;
  local_188.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_188.Amatrix,(ChQuaternion<double> *)&local_100);
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  local_100._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_100.coord.pos.m_data[0] = 0.0;
  local_100.coord.pos.m_data[1] = 0.0;
  local_100.coord.pos.m_data[2] = 0.0;
  local_100.coord.rot.m_data[0] = 1.0;
  local_100.coord.rot.m_data[1] = 0.0;
  local_100.coord.rot.m_data[2] = 0.0;
  local_100.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_100.Amatrix,(ChQuaternion<double> *)&local_258);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)(this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1,
             &this->local_shaft1,&local_188);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)(this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2,
             &this->local_shaft2,&local_100);
  Get_shaft_pos1((ChVector<double> *)&local_258,this);
  Get_shaft_pos2(&local_2c8,this);
  local_2d8 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1]
              - local_2c8.m_data[1];
  local_398 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
              - local_2c8.m_data[2];
  auVar62._8_8_ = 0;
  auVar62._0_8_ = local_398;
  uStack_2d0 = 0;
  local_2f8._8_8_ = 0;
  local_2f8._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] -
       local_2c8.m_data[0];
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_2d8 * local_2d8;
  auVar121._8_8_ = 0;
  auVar121._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] -
       local_2c8.m_data[0];
  auVar58 = vfmadd231sd_fma(auVar58,local_2f8,auVar121);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = local_398;
  auVar58 = vfmadd231sd_fma(auVar58,auVar104,auVar104);
  auVar78._0_8_ = auVar58._0_8_;
  uStack_390 = 0;
  if (auVar78._0_8_ < 0.0) {
    local_2e0 = sqrt(auVar78._0_8_);
    auVar62._8_8_ = uStack_390;
    auVar62._0_8_ = local_398;
  }
  else {
    auVar58 = vsqrtsd_avx(auVar58,auVar58);
    local_2e0 = auVar58._0_8_;
  }
  auVar142._0_8_ = local_2f8._0_8_ ^ 0x8000000000000000;
  auVar142._8_8_ = local_2f8._8_8_ ^ 0x8000000000000000;
  dVar157 = -local_2d8;
  auVar150._0_8_ = auVar62._0_8_ ^ 0x8000000000000000;
  auVar150._8_8_ = auVar62._8_8_ ^ 0x8000000000000000;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar169._8_8_ = 0;
  auVar169._0_8_ =
       local_2d8 *
       local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar58 = vfnmsub231sd_fma(auVar169,local_2f8,auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar104 = vfnmadd231sd_fma(auVar58,auVar62,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar133._8_8_ = 0;
  auVar133._0_8_ =
       local_2d8 *
       local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar58 = vfnmsub231sd_fma(auVar133,local_2f8,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar58 = vfnmadd231sd_fma(auVar58,auVar62,auVar5);
  dVar52 = auVar58._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar52 * dVar52;
  auVar58 = vfmadd231sd_fma(auVar68,auVar104,auVar104);
  if (auVar58._0_8_ < 0.0) {
    local_388._0_8_ = dVar52;
    dVar63 = sqrt(auVar58._0_8_);
    dVar52 = (double)local_388._0_8_;
  }
  else {
    auVar58 = vsqrtsd_avx(auVar58,auVar58);
    dVar63 = auVar58._0_8_;
  }
  bVar35 = 2.2250738585072014e-308 <= dVar63;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar170._8_8_ = 0;
  auVar170._0_8_ =
       dVar157 * local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar58 = vfmadd231sd_fma(auVar170,auVar142,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar58 = vfmadd231sd_fma(auVar58,auVar150,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar158._8_8_ = 0;
  auVar158._0_8_ =
       dVar157 * local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar62 = vfmadd231sd_fma(auVar158,auVar142,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_100.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar62 = vfmadd231sd_fma(auVar62,auVar150,auVar9);
  dVar157 = auVar62._0_8_;
  auVar69._8_8_ = 0;
  auVar69._0_8_ = dVar157 * dVar157;
  auVar62 = vfmadd231sd_fma(auVar69,auVar58,auVar58);
  if (auVar62._0_8_ < 0.0) {
    dVar66 = sqrt(auVar62._0_8_);
  }
  else {
    auVar62 = vsqrtsd_avx(auVar62,auVar62);
    dVar66 = auVar62._0_8_;
  }
  bVar36 = 2.2250738585072014e-308 <= dVar66;
  dVar63 = ChAtan2((double)((ulong)bVar35 * (long)(auVar104._0_8_ * (1.0 / dVar63)) +
                           (ulong)!bVar35 * 0x3ff0000000000000),
                   (double)((ulong)bVar35 * (long)(dVar52 * (1.0 / dVar63))));
  auVar100._0_8_ =
       ChAtan2((double)((ulong)bVar36 * (long)(auVar58._0_8_ * (1.0 / dVar66)) +
                       (ulong)!bVar36 * 0x3ff0000000000000),
               (double)((ulong)bVar36 * (long)(dVar157 * (1.0 / dVar66))));
  auVar100._8_56_ = extraout_var;
  dVar52 = this->a1;
  dVar157 = this->a2;
  auVar143._0_8_ = dVar52 / 6.283185307179586;
  auVar143._8_8_ = 0;
  auVar58 = vroundsd_avx(auVar143,auVar143,9);
  auVar151._0_8_ = dVar157 / 6.283185307179586;
  auVar151._8_8_ = 0;
  auVar104 = vroundsd_avx(auVar151,auVar151,9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar63;
  auVar58 = vfmadd213sd_fma(auVar58,ZEXT816(0x401921fb54442d18),auVar10);
  dVar63 = auVar58._0_8_;
  auVar176._8_8_ = 0x7fffffffffffffff;
  auVar176._0_8_ = 0x7fffffffffffffff;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = (dVar63 + 6.283185307179586) - dVar52;
  auVar58 = vandpd_avx(auVar173,auVar176);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = dVar63 - dVar52;
  auVar62 = vandpd_avx(auVar176,auVar105);
  uVar34 = vcmpsd_avx512f(auVar58,auVar62,1);
  bVar35 = (bool)((byte)uVar34 & 1);
  dVar52 = (double)((ulong)bVar35 * (long)(dVar63 + 6.283185307179586) +
                   (ulong)!bVar35 * (long)dVar63);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = (dVar63 + -6.283185307179586) - dVar52;
  auVar58 = vandpd_avx(auVar176,auVar159);
  auVar144._8_8_ = 0;
  auVar144._0_8_ = dVar63 - dVar52;
  auVar62 = vandpd_avx(auVar176,auVar144);
  uVar34 = vcmpsd_avx512f(auVar58,auVar62,1);
  bVar35 = (bool)((byte)uVar34 & 1);
  this->a1 = (double)((ulong)bVar35 * (long)(dVar63 + -6.283185307179586) +
                     (ulong)!bVar35 * (long)dVar52);
  auVar58 = vfmadd213sd_fma(auVar104,ZEXT816(0x401921fb54442d18),auVar100._0_16_);
  dVar63 = auVar58._0_8_;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = (dVar63 + 6.283185307179586) - dVar157;
  auVar58 = vandpd_avx(auVar176,auVar134);
  auVar122._8_8_ = 0;
  auVar122._0_8_ = dVar63 - dVar157;
  auVar62 = vandpd_avx(auVar176,auVar122);
  uVar34 = vcmpsd_avx512f(auVar58,auVar62,1);
  bVar35 = (bool)((byte)uVar34 & 1);
  dVar52 = (double)((ulong)bVar35 * (long)(dVar63 + 6.283185307179586) +
                   (ulong)!bVar35 * (long)dVar63);
  auVar70._8_8_ = 0;
  auVar70._0_8_ = (dVar63 + -6.283185307179586) - dVar52;
  auVar58 = vandpd_avx(auVar176,auVar70);
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar63 - dVar52;
  auVar62 = vandpd_avx(auVar176,auVar135);
  uVar34 = vcmpsd_avx512f(auVar58,auVar62,1);
  bVar35 = (bool)((byte)uVar34 & 1);
  this->a2 = (double)((ulong)bVar35 * (long)(dVar63 + -6.283185307179586) +
                     (ulong)!bVar35 * (long)dVar52);
  auVar78._8_8_ = 0;
  if (auVar78._0_8_ < 0.0) {
    dVar52 = sqrt(auVar78._0_8_);
  }
  else {
    auVar58 = vsqrtsd_avx(auVar78,auVar78);
    dVar52 = auVar58._0_8_;
  }
  bVar35 = 2.2250738585072014e-308 <= dVar52;
  dVar52 = 1.0 / dVar52;
  dVar157 = (double)((ulong)bVar35 * (long)(dVar52 * local_2d8));
  local_438._0_8_ =
       (ulong)bVar35 * (long)(dVar52 * (double)local_2f8._0_8_) +
       (ulong)!bVar35 * 0x3ff0000000000000;
  local_438._8_8_ = 0;
  local_418._0_8_ = (ulong)bVar35 * (long)(dVar52 * local_398);
  local_418._8_8_ = 0;
  Get_shaft_dir1((ChVector<double> *)&local_258,this);
  dVar63 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  dVar52 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar152._8_8_ = 0;
  auVar152._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar160._8_8_ = 0;
  auVar160._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar165._8_8_ = 0;
  auVar165._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar157;
  auVar145._8_8_ = 0;
  auVar145._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] *
       (double)local_418._0_8_;
  auVar62 = vfmsub231sd_fma(auVar145,auVar43,auVar165);
  auVar174._8_8_ = 0;
  auVar174._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
       (double)local_438._0_8_;
  auVar58 = vfmsub231sd_fma(auVar174,auVar152,local_418);
  auVar177._8_8_ = 0;
  auVar177._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       dVar157;
  auVar78 = vfmsub231sd_fma(auVar177,auVar160,local_438);
  local_348 = auVar78._0_8_;
  local_338 = auVar58._0_8_;
  auVar71._8_8_ = 0;
  auVar71._0_8_ = local_338 * local_338;
  auVar58 = vfmadd231sd_fma(auVar71,auVar62,auVar62);
  auVar58 = vfmadd231sd_fma(auVar58,auVar78,auVar78);
  if (auVar58._0_8_ < 0.0) {
    local_388._0_8_ =
         local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    dVar64 = sqrt(auVar58._0_8_);
    auVar165._8_8_ = 0;
    auVar165._0_8_ = local_388._0_8_;
    dVar66 = local_338;
    pCVar42 = local_348;
  }
  else {
    auVar58 = vsqrtsd_avx(auVar58,auVar58);
    dVar64 = auVar58._0_8_;
    dVar66 = local_338;
    pCVar42 = local_348;
  }
  auVar153._8_8_ = 0;
  auVar153._0_8_ = dVar52;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = dVar63;
  uStack_340 = 0;
  uStack_33c = 0x80000000;
  local_348 = (ChMatrix33<double> *)(local_418._0_8_ ^ 0x8000000000000000);
  uStack_330 = 0;
  uStack_32c = 0x80000000;
  local_338 = -(double)local_438._0_8_;
  local_3d8 = -dVar157;
  bVar35 = 2.2250738585072014e-308 <= dVar64;
  dVar64 = 1.0 / dVar64;
  dVar66 = (double)((ulong)bVar35 * (long)(dVar66 * dVar64));
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar66;
  local_388._0_8_ =
       (ulong)bVar35 * (long)(auVar62._0_8_ * dVar64) + (ulong)!bVar35 * 0x3ff0000000000000;
  local_388._8_8_ = 0;
  dVar64 = (double)((ulong)bVar35 * (long)((double)pCVar42 * dVar64));
  auVar54._8_8_ = 0;
  auVar54._0_8_ = dVar64;
  auVar106._8_8_ = 0;
  auVar106._0_8_ = dVar66 * auVar165._0_8_;
  auVar58 = vfmsub231sd_fma(auVar106,auVar161,auVar54);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = dVar64 * dVar52;
  auVar62 = vfmsub231sd_fma(auVar72,local_388,auVar165);
  auVar123._8_8_ = 0;
  auVar123._0_8_ = (double)local_388._0_8_ * dVar63;
  auVar78 = vfmsub231sd_fma(auVar123,auVar153,auVar53);
  local_318 = auVar62._0_8_;
  local_310 = auVar58._0_8_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = local_318 * local_318;
  auVar58 = vfmadd231sd_fma(auVar73,auVar58,auVar58);
  local_320 = auVar78._0_8_;
  auVar58 = vfmadd231sd_fma(auVar58,auVar78,auVar78);
  if (auVar58._0_8_ < 0.0) {
    local_280 = sqrt(auVar58._0_8_);
  }
  else {
    auVar58 = vsqrtsd_avx(auVar58,auVar58);
    local_280 = auVar58._0_8_;
  }
  bVar35 = 2.2250738585072014e-308 <= local_280;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar157;
  auVar154._8_8_ = 0;
  auVar154._0_8_ = dVar157 * dVar64;
  auVar58 = vfmsub231sd_fma(auVar154,auVar53,local_418);
  local_308 = auVar58._0_8_;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = (double)local_418._0_8_ * local_388._0_8_;
  auVar62 = vfmsub231sd_fma(auVar162,auVar54,local_438);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = (double)local_438._0_8_ * dVar66;
  auVar78 = vfmsub231sd_fma(auVar166,local_388,auVar44);
  local_368 = auVar78._0_8_;
  local_358 = auVar62._0_8_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = local_358 * local_358;
  auVar58 = vfmadd231sd_fma(auVar74,auVar58,auVar58);
  auVar58 = vfmadd231sd_fma(auVar58,auVar78,auVar78);
  if (auVar58._0_8_ < 0.0) {
    dVar52 = sqrt(auVar58._0_8_);
  }
  else {
    auVar58 = vsqrtsd_avx(auVar58,auVar58);
    dVar52 = auVar58._0_8_;
  }
  bVar36 = 2.2250738585072014e-308 <= dVar52;
  dVar52 = 1.0 / dVar52;
  dVar63 = dVar52 * local_308;
  dVar32 = dVar52 * local_368;
  local_308 = (double)((ulong)bVar36 * (long)(dVar52 * local_358));
  uStack_300 = 0;
  local_368 = (double)((ulong)bVar36 * (long)dVar63 + (ulong)!bVar36 * 0x3ff0000000000000);
  uStack_360 = 0;
  local_358 = (double)((ulong)bVar36 * (long)dVar32);
  uStack_350 = 0;
  Get_shaft_dir2((ChVector<double> *)&local_258,this);
  dVar52 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar146._8_8_ = 0;
  auVar146._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar155._8_8_ = 0;
  auVar155._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar163._8_8_ = 0;
  auVar163._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar157;
  auVar124._8_8_ = 0;
  auVar124._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] *
       (double)local_348;
  auVar58 = vfmadd231sd_fma(auVar124,auVar163,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_418._0_8_;
  auVar167._8_8_ = 0;
  auVar167._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] *
       local_338;
  auVar62 = vfmadd231sd_fma(auVar167,auVar146,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_438._0_8_;
  auVar171._8_8_ = 0;
  auVar171._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] *
       local_3d8;
  auVar78 = vfmadd231sd_fma(auVar171,auVar155,auVar13);
  dVar63 = auVar62._0_8_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = dVar63 * dVar63;
  auVar62 = vfmadd231sd_fma(auVar75,auVar58,auVar58);
  auVar62 = vfmadd231sd_fma(auVar62,auVar78,auVar78);
  if (auVar62._0_8_ < 0.0) {
    local_338 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
    local_348 = (ChMatrix33<double> *)
                local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2];
    local_370 = auVar58._0_8_;
    local_278 = auVar78._0_8_;
    dVar65 = sqrt(auVar62._0_8_);
    auVar163._8_8_ = 0;
    auVar163._0_8_ = local_348;
    auVar155._8_8_ = 0;
    auVar155._0_8_ = local_338;
    dVar120 = local_370;
    dVar32 = local_278;
  }
  else {
    auVar62 = vsqrtsd_avx(auVar62,auVar62);
    dVar65 = auVar62._0_8_;
    dVar120 = auVar58._0_8_;
    dVar32 = auVar78._0_8_;
  }
  auVar147._8_8_ = 0;
  auVar147._0_8_ = dVar52;
  bVar36 = 2.2250738585072014e-308 <= dVar65;
  dVar65 = 1.0 / dVar65;
  dVar63 = (double)((ulong)bVar36 * (long)(dVar63 * dVar65));
  auVar55._8_8_ = 0;
  auVar55._0_8_ = dVar63;
  auVar56._0_8_ =
       (double)((ulong)bVar36 * (long)(dVar120 * dVar65) + (ulong)!bVar36 * 0x3ff0000000000000);
  auVar56._8_8_ = 0;
  dVar32 = (double)((ulong)bVar36 * (long)(dVar32 * dVar65));
  auVar57._8_8_ = 0;
  auVar57._0_8_ = dVar32;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = dVar63 * auVar163._0_8_;
  auVar62 = vfmsub231sd_fma(auVar107,auVar155,auVar57);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = dVar32 * dVar52;
  auVar58 = vfmsub231sd_fma(auVar76,auVar56,auVar163);
  auVar136._8_8_ = 0;
  auVar136._0_8_ = auVar56._0_8_ * auVar155._0_8_;
  auVar78 = vfmsub231sd_fma(auVar136,auVar147,auVar55);
  local_338 = auVar58._0_8_;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = local_338 * local_338;
  auVar58 = vfmadd231sd_fma(auVar77,auVar62,auVar62);
  local_348 = auVar78._0_8_;
  auVar58 = vfmadd231sd_fma(auVar58,auVar78,auVar78);
  if (auVar58._0_8_ < 0.0) {
    local_370 = sqrt(auVar58._0_8_);
  }
  else {
    auVar58 = vsqrtsd_avx(auVar58,auVar58);
    local_370 = auVar58._0_8_;
  }
  bVar41 = 2.2250738585072014e-308 <= local_370;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_388._0_8_;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = local_368
  ;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = local_308
  ;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = local_358
  ;
  dVar52 = this->beta;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)local_438._0_8_;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar66;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] = dVar157;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] = dVar64;
  local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       (double)local_418._0_8_;
  dVar63 = cos(dVar52);
  auVar101._0_8_ = sin(dVar52);
  auVar101._8_56_ = extraout_var_00;
  local_2c8.m_data[1] = dVar63 * 0.0;
  auVar37._8_8_ = 0x8000000000000000;
  auVar37._0_8_ = 0x8000000000000000;
  auVar58 = vxorpd_avx512vl(auVar101._0_16_,auVar37);
  local_2c8.m_data[2] = (double)vmovlpd_avx(auVar58);
  local_2b0 = auVar101._0_8_ * 0.0;
  local_298 = auVar101._0_8_ + 0.0;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = local_2b0;
  auVar58 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar125,ZEXT816(0x3ff0000000000000));
  local_2a8 = auVar58._0_8_;
  local_3b0.m_data[0] = (double)&local_258;
  local_3b0.m_data[1] = (double)&local_2c8;
  local_2c8.m_data[0] = dVar63;
  local_2a0 = local_2c8.m_data[1];
  local_290 = local_2b0;
  local_288 = dVar63;
  ChMatrix33<double>::
  ChMatrix33<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (&local_78,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_3b0);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.react_force.m_data[0];
  uVar34 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar14,0xe);
  bVar36 = (bool)((byte)uVar34 & 1);
  dVar52 = (double)((ulong)bVar36 * (long)this->alpha + (ulong)!bVar36 * (long)-this->alpha);
  dVar63 = cos(dVar52);
  auVar102._0_8_ = sin(dVar52);
  auVar102._8_56_ = extraout_var_01;
  auVar137._8_8_ = 0;
  auVar137._0_8_ = dVar63;
  local_2c8.m_data[2] = -0.0;
  auVar78 = auVar102._0_16_;
  auVar58 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar137,auVar78);
  local_2b0 = auVar58._0_8_;
  auVar58 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar78,auVar137);
  local_2a8 = auVar58._0_8_;
  local_2a0 = 0.0;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = auVar102._0_8_ * 0.0;
  auVar58 = vfmadd231sd_fma(auVar108,auVar137,ZEXT816(0) << 0x40);
  local_298 = auVar58._0_8_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = dVar63 * -0.0;
  auVar58 = vfmadd231sd_fma(auVar109,auVar78,ZEXT816(0) << 0x40);
  local_290 = auVar58._0_8_;
  local_288 = 1.0;
  local_3b0.m_data[0] = (double)&local_78;
  local_3b0.m_data[1] = (double)&local_2c8;
  local_2c8.m_data[0] = dVar63;
  local_2c8.m_data[1] = auVar102._0_8_;
  ChMatrix33<double>::operator=
            (&local_258,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_3b0);
  dVar63 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  dVar52 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_278 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
  ;
  local_308 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2]
  ;
  local_388._0_8_ =
       local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_1d0 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4]
  ;
  local_368 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5]
  ;
  local_358 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6]
  ;
  local_1d8 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8]
  ;
  Get_shaft_dir1(&local_3b0,this);
  Get_shaft_dir2(&local_270,this);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = local_3b0.m_data[0];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_270.m_data[0];
  auVar110._8_8_ = 0;
  auVar110._0_8_ = local_3b0.m_data[1] * local_270.m_data[1];
  auVar58 = vfmadd231sd_fma(auVar110,auVar79,auVar15);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = local_3b0.m_data[2];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_270.m_data[2];
  auVar58 = vfmadd132sd_fma(auVar80,auVar58,auVar16);
  dVar66 = acos(auVar58._0_8_);
  Get_shaft_dir1(&local_3b0,this);
  Get_shaft_dir2(&local_270,this);
  auVar78 = local_2f8;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = local_3b0.m_data[0];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_270.m_data[0];
  auVar111._8_8_ = 0;
  auVar111._0_8_ = local_3b0.m_data[1] * local_270.m_data[1];
  auVar58 = vfmadd231sd_fma(auVar111,auVar81,auVar17);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = local_3b0.m_data[2];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_270.m_data[2];
  auVar58 = vfmadd132sd_fma(auVar82,auVar58,auVar18);
  auVar38._8_8_ = 0x7fffffffffffffff;
  auVar38._0_8_ = 0x7fffffffffffffff;
  auVar58 = vandpd_avx512vl(auVar58,auVar38);
  if (0.96 < auVar58._0_8_) {
    dVar157 = 1.0 / local_280;
    auVar59._0_8_ =
         (ulong)bVar35 * (long)(dVar157 * local_310) + (ulong)!bVar35 * 0x3ff0000000000000;
    auVar59._8_8_ = 0;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = (ulong)bVar35 * (long)(dVar157 * (double)local_320);
    auVar112._8_8_ = 0;
    auVar112._0_8_ = (double)((ulong)bVar35 * (long)(dVar157 * local_318)) * local_2d8;
    auVar58 = vfmadd213sd_fma(local_2f8,auVar59,auVar112);
    auVar45._8_8_ = uStack_390;
    auVar45._0_8_ = local_398;
    auVar58 = vfmadd213sd_fma(auVar45,auVar60,auVar58);
    dVar157 = this->tau;
    dVar66 = auVar58._0_8_;
    if (this->epicyclic == false) {
      dVar64 = dVar66 / (1.0 / dVar157 + 1.0);
    }
    else {
      dVar64 = (dVar66 * dVar157) / (dVar157 + -1.0);
    }
    pdVar51 = &this->r2;
    this->r2 = dVar66 - dVar64;
  }
  else {
    local_2f8._1_3_ = 0;
    local_2f8[0] = this->epicyclic;
    local_2f8._4_12_ = auVar78._4_12_;
    local_2d8 = this->tau;
    uStack_2d0 = 0;
    Get_shaft_dir2(&local_3b0,this);
    pdVar51 = &this->tau;
    auVar46._8_8_ = uStack_2d0;
    auVar46._0_8_ = local_2d8;
    auVar39._8_8_ = 0x8000000000000000;
    auVar39._0_8_ = 0x8000000000000000;
    auVar58 = vxorpd_avx512vl(auVar46,auVar39);
    local_2f8._0_8_ =
         dVar66 / ((double)((ulong)(local_2f8[0] & 1) * auVar58._0_8_ +
                           (ulong)!(bool)(local_2f8[0] & 1) * (long)local_2d8) + 1.0);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = local_3b0.m_data[0];
    auVar83._8_8_ = 0;
    auVar83._0_8_ = dVar157 * local_3b0.m_data[1];
    auVar58 = vfmadd231sd_fma(auVar83,local_438,auVar19);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = local_3b0.m_data[2];
    auVar58 = vfmadd231sd_fma(auVar58,local_418,auVar20);
    dVar157 = acos(auVar58._0_8_);
    dVar64 = sin((dVar157 + -3.141592653589793 + 3.141592653589793) - dVar66);
    dVar66 = sin(dVar66);
    dVar66 = local_2e0 / dVar66;
    dVar157 = tan((double)local_2f8._0_8_);
    dVar157 = dVar157 * dVar66 * dVar64;
    this->r2 = dVar157;
  }
  this->r1 = dVar157 * *pdVar51;
  Get_shaft_pos2(&local_3b0,this);
  dVar64 = 1.0 / local_370;
  dVar157 = this->r2;
  dVar66 = (double)((ulong)bVar41 * (long)(dVar64 * auVar62._0_8_) +
                   (ulong)!bVar41 * 0x3ff0000000000000) * dVar157 + local_3b0.m_data[0];
  local_2d8 = (double)((ulong)bVar41 * (long)(dVar64 * local_338)) * dVar157 + local_3b0.m_data[1];
  dVar157 = (double)((ulong)bVar41 * (long)(dVar64 * (double)local_348)) * dVar157 +
            local_3b0.m_data[2];
  (this->contact_pt).m_data[0] = dVar66;
  (this->contact_pt).m_data[1] = local_2d8;
  (this->contact_pt).m_data[2] = dVar157;
  local_2f8._0_8_ = dVar66;
  dVar64 = dVar157;
  local_438._0_8_ = local_2d8;
  if (this->checkphase == true) {
    dVar66 = (-this->a2 /
              (double)((ulong)(this->epicyclic & 1) * (long)-this->tau +
                      (ulong)!(bool)(this->epicyclic & 1) * (long)this->tau) - this->a1) -
             this->phase;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = dVar66;
    uVar34 = vcmpsd_avx512f(auVar84,ZEXT816(0x400921fb54442d18),0xe);
    bVar35 = (bool)((byte)uVar34 & 1);
    auVar61._0_8_ =
         (ulong)bVar35 * (long)(dVar66 + -6.283185307179586) + (ulong)!bVar35 * (long)dVar66;
    auVar61._8_8_ = 0;
    auVar58 = vminsd_avx(ZEXT816(0x3fe921fb54442d18),auVar61);
    uVar34 = vcmpsd_avx512f(auVar58,ZEXT816(0xbfe921fb54442d18),1);
    bVar35 = (bool)((byte)uVar34 & 1);
    dVar66 = (double)((ulong)bVar35 * 0x3fe921fb54442d18 +
                     (ulong)!bVar35 * (auVar58._0_8_ ^ 0x8000000000000000));
    dVar64 = cos(dVar66);
    auVar103._0_8_ = sin(dVar66);
    auVar103._8_56_ = extraout_var_02;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = dVar64;
    local_2c8.m_data[2] = -0.0;
    auVar62 = auVar103._0_16_;
    auVar58 = vfmsub213sd_fma(ZEXT816(0) << 0x40,auVar138,auVar62);
    local_2b0 = auVar58._0_8_;
    auVar58 = vfmadd213sd_fma(ZEXT816(0) << 0x40,auVar62,auVar138);
    local_2a8 = auVar58._0_8_;
    local_2a0 = 0.0;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = auVar103._0_8_ * 0.0;
    auVar58 = vfmadd231sd_fma(auVar126,auVar138,ZEXT816(0) << 0x40);
    local_298 = auVar58._0_8_;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = dVar64 * -0.0;
    auVar58 = vfmadd231sd_fma(auVar127,auVar62,ZEXT816(0) << 0x40);
    local_290 = auVar58._0_8_;
    local_288 = 1.0;
    local_2c8.m_data[0] = dVar64;
    local_2c8.m_data[1] = auVar103._0_8_;
    Get_shaft_pos1(&local_3b0,this);
    local_1f8 = (ChMatrix33<double> *)local_3b0.m_data[0];
    local_200 = (ChVector<double> *)local_3b0.m_data[1];
    local_210 = local_3b0.m_data[2];
    local_338 = local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [6];
    local_318 = local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
    local_398 = local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
    local_370 = local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [8];
    local_320 = (ChVector<double> *)local_2c8.m_data[0];
    local_2e0 = local_2c8.m_data[1];
    local_280 = local_2c8.m_data[2];
    local_1e0 = (ulong)local_2b0;
    local_1e8 = local_2a8;
    local_310 = local_2a0;
    local_1f0 = (ulong)local_298;
    local_208 = local_290;
    local_348 = (ChMatrix33<double> *)local_288;
    Get_shaft_pos1(&local_3b0,this);
    dVar66 = local_2d8 - (double)local_200;
    auVar175._8_8_ = 0;
    auVar175._0_8_ = local_398;
    auVar168._8_8_ = 0;
    auVar168._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    auVar113._8_8_ = 0;
    auVar113._0_8_ = (double)local_2f8._0_8_ - (double)local_1f8;
    auVar139._8_8_ = 0;
    auVar139._0_8_ = local_398 * dVar66;
    auVar58 = vfmadd231sd_fma(auVar139,auVar168,auVar113);
    auVar180._8_8_ = 0;
    auVar180._0_8_ = local_370;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = dVar157 - local_210;
    auVar78 = vfmadd231sd_fma(auVar58,auVar180,auVar85);
    auVar172._8_8_ = 0;
    auVar172._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    auVar156._8_8_ = 0;
    auVar156._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar148._8_8_ = 0;
    auVar148._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
         dVar66;
    auVar58 = vfmadd231sd_fma(auVar148,auVar156,auVar113);
    auVar178._8_8_ = 0;
    auVar178._0_8_ = local_338;
    auVar104 = vfmadd231sd_fma(auVar58,auVar178,auVar85);
    auVar164._8_8_ = 0;
    auVar164._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    auVar114._8_8_ = 0;
    auVar114._0_8_ = (double)local_2f8._0_8_ - (double)local_1f8;
    auVar128._8_8_ = 0;
    auVar128._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
         dVar66;
    auVar58 = vfmadd231sd_fma(auVar128,auVar164,auVar114);
    auVar115._8_8_ = 0;
    auVar115._0_8_ = local_318;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = dVar157 - local_210;
    auVar58 = vfmadd231sd_fma(auVar58,auVar115,auVar86);
    dVar66 = auVar58._0_8_;
    auVar181._8_8_ = 0;
    auVar181._0_8_ = local_1f0;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = dVar66 * local_208;
    auVar58 = vfmadd213sd_fma(auVar181,auVar104,auVar87);
    auVar179._8_8_ = 0;
    auVar179._0_8_ = local_348;
    auVar58 = vfmadd213sd_fma(auVar179,auVar78,auVar58);
    auVar183._8_8_ = 0;
    auVar183._0_8_ = local_1e0;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = dVar66 * local_1e8;
    auVar62 = vfmadd213sd_fma(auVar183,auVar104,auVar88);
    auVar182._8_8_ = 0;
    auVar182._0_8_ = local_310;
    auVar62 = vfmadd213sd_fma(auVar182,auVar78,auVar62);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = local_320;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = dVar66 * local_2e0;
    auVar104 = vfmadd231sd_fma(auVar89,auVar104,auVar21);
    auVar22._8_8_ = 0;
    auVar22._0_8_ = local_280;
    auVar78 = vfmadd231sd_fma(auVar104,auVar78,auVar22);
    dVar66 = auVar62._0_8_;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = dVar66 * local_318;
    auVar62 = vfmadd231sd_fma(auVar116,auVar78,auVar178);
    auVar62 = vfmadd231sd_fma(auVar62,auVar58,auVar180);
    auVar129._8_8_ = 0;
    auVar129._0_8_ =
         local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
         dVar66;
    auVar104 = vfmadd231sd_fma(auVar129,auVar78,auVar172);
    auVar104 = vfmadd231sd_fma(auVar104,auVar58,auVar175);
    auVar140._8_8_ = 0;
    auVar140._0_8_ =
         dVar66 * local_188.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[1];
    auVar78 = vfmadd231sd_fma(auVar140,auVar156,auVar78);
    auVar58 = vfmadd231sd_fma(auVar78,auVar168,auVar58);
    dVar66 = auVar58._0_8_ + local_3b0.m_data[0];
    local_438._0_8_ = auVar104._0_8_ + local_3b0.m_data[1];
    dVar64 = auVar62._0_8_ + local_3b0.m_data[2];
  }
  Get_shaft_dir1(&local_3b0,this);
  Get_shaft_pos1(&local_270,this);
  dVar32 = (this->contact_pt).m_data[0];
  local_398 = (this->contact_pt).m_data[1];
  local_338 = local_270.m_data[1];
  local_310 = (this->contact_pt).m_data[2];
  local_318 = local_270.m_data[2];
  local_348 = (ChMatrix33<double> *)local_3b0.m_data[0];
  local_320 = (ChVector<double> *)local_3b0.m_data[1];
  local_370 = local_3b0.m_data[2];
  Get_shaft_dir1(&local_3b0,this);
  dVar49 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  dVar48 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  dVar47 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dVar120 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  dVar65 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = local_348;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = (local_398 - local_338) * (double)local_320;
  auVar130._8_8_ = 0;
  auVar130._0_8_ = dVar32 - local_270.m_data[0];
  auVar58 = vfmadd231sd_fma(auVar90,auVar130,auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_370;
  auVar117._8_8_ = 0;
  auVar117._0_8_ = local_310 - local_318;
  auVar58 = vfmadd231sd_fma(auVar58,auVar117,auVar24);
  auVar40._8_8_ = 0x7fffffffffffffff;
  auVar40._0_8_ = 0x7fffffffffffffff;
  auVar62 = vandpd_avx512vl(auVar58,auVar40);
  if (0.0001 < auVar62._0_8_) {
    pCVar31 = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1;
    dVar67 = auVar58._0_8_;
    dVar33 = dVar67 * local_3b0.m_data[1];
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         *(double *)
          ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
          0x10);
    auVar131._8_8_ = 0;
    auVar131._0_8_ = dVar67 * local_3b0.m_data[0];
    auVar141._8_8_ = 0;
    auVar141._0_8_ =
         dVar33 * *(double *)
                   ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data + 0x28);
    auVar58 = vfmadd231sd_fma(auVar141,auVar131,auVar25);
    auVar26._8_8_ = 0;
    auVar26._0_8_ =
         *(double *)
          ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
          0x40);
    auVar118._8_8_ = 0;
    auVar118._0_8_ = dVar67 * local_3b0.m_data[2];
    auVar58 = vfmadd231sd_fma(auVar58,auVar118,auVar26);
    dVar32 = (this->local_shaft1).coord.pos.m_data[2];
    auVar27._8_8_ = 0;
    auVar27._0_8_ =
         *(double *)
          ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data + 8)
    ;
    auVar149._8_8_ = 0;
    auVar149._0_8_ =
         dVar33 * *(double *)
                   ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data + 0x20);
    auVar62 = vfmadd231sd_fma(auVar149,auVar131,auVar27);
    auVar28._8_8_ = 0;
    auVar28._0_8_ =
         *(double *)
          ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
          0x38);
    auVar62 = vfmadd231sd_fma(auVar62,auVar118,auVar28);
    dVar1 = (this->local_shaft1).coord.pos.m_data[1];
    auVar29._8_8_ = 0;
    auVar29._0_8_ =
         (pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
         super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    auVar91._8_8_ = 0;
    auVar91._0_8_ =
         dVar33 * *(double *)
                   ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                           super_Matrix<double,_3,_3,_1,_3,_3>.
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                           m_data + 0x18);
    auVar132._8_8_ = 0;
    auVar132._0_8_ = dVar67 * local_3b0.m_data[0];
    auVar78 = vfmadd231sd_fma(auVar91,auVar132,auVar29);
    auVar30._8_8_ = 0;
    auVar30._0_8_ =
         *(double *)
          ((long)&(pCVar31->super_ChFrameMoving<double>).super_ChFrame<double>.Amatrix.
                  super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
          0x30);
    auVar119._8_8_ = 0;
    auVar119._0_8_ = dVar67 * local_3b0.m_data[2];
    auVar78 = vfmadd231sd_fma(auVar78,auVar119,auVar30);
    (this->local_shaft1).coord.pos.m_data[0] =
         auVar78._0_8_ + (this->local_shaft1).coord.pos.m_data[0];
    (this->local_shaft1).coord.pos.m_data[1] = auVar62._0_8_ + dVar1;
    (this->local_shaft1).coord.pos.m_data[2] = auVar58._0_8_ + dVar32;
  }
  ((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->motion_type = M_MOTION_EXTERNAL;
  ((this->super_ChLinkLock).super_ChLinkMarkers.marker1)->motion_type = M_MOTION_EXTERNAL;
  local_1c8.pos.m_data[1] = (double)local_438._0_8_;
  dVar32 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] +
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] +
           local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_1c8.pos.m_data[0] = dVar66;
  local_1c8.pos.m_data[2] = dVar64;
  if (0.0 <= dVar32) {
    dVar32 = dVar32 + 1.0;
    if (dVar32 < 0.0) {
      local_398 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                  array[5];
      local_1c8.rot.m_data[3] = sqrt(dVar32);
      dVar66 = local_398;
    }
    else {
      auVar92._8_8_ = 0;
      auVar92._0_8_ = dVar32;
      auVar58 = vsqrtsd_avx(auVar92,auVar92);
      local_1c8.rot.m_data[3] = auVar58._0_8_;
      dVar66 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [5];
    }
    local_1c8.rot.m_data[0] = local_1c8.rot.m_data[3] * 0.5;
    local_1c8.rot.m_data[3] = 0.5 / local_1c8.rot.m_data[3];
    local_1c8.rot.m_data[1] = (dVar49 - dVar66) * local_1c8.rot.m_data[3];
    local_1c8.rot.m_data[2] = (dVar120 - dVar48) * local_1c8.rot.m_data[3];
    local_1c8.rot.m_data[3] = (dVar47 - dVar65) * local_1c8.rot.m_data[3];
  }
  else {
    cVar50 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0]
             < local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
    dVar66 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    if ((bool)cVar50) {
      dVar66 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4];
    }
    if (dVar66 < local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8]) {
      cVar50 = '\x02';
    }
    if (cVar50 == '\x02') {
      dVar66 = ((local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8] - local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0]) -
               local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [4]) + 1.0;
      if (dVar66 < 0.0) {
        local_398 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[5];
        local_1c8.rot.m_data[0] = sqrt(dVar66);
        dVar66 = local_398;
      }
      else {
        auVar94._8_8_ = 0;
        auVar94._0_8_ = dVar66;
        auVar58 = vsqrtsd_avx(auVar94,auVar94);
        local_1c8.rot.m_data[0] = auVar58._0_8_;
        dVar66 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
      }
      local_1c8.rot.m_data[3] = local_1c8.rot.m_data[0] * 0.5;
      local_1c8.rot.m_data[0] = 0.5 / local_1c8.rot.m_data[0];
      local_1c8.rot.m_data[1] = (dVar48 + dVar120) * local_1c8.rot.m_data[0];
      local_1c8.rot.m_data[2] = (dVar66 + dVar49) * local_1c8.rot.m_data[0];
      dVar120 = dVar47 - dVar65;
    }
    else if (cVar50 == '\x01') {
      dVar66 = ((local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4] - local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[8]) -
               local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0]) + 1.0;
      if (dVar66 < 0.0) {
        local_398 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[5];
        local_1c8.rot.m_data[0] = sqrt(dVar66);
        dVar66 = local_398;
      }
      else {
        auVar93._8_8_ = 0;
        auVar93._0_8_ = dVar66;
        auVar58 = vsqrtsd_avx(auVar93,auVar93);
        local_1c8.rot.m_data[0] = auVar58._0_8_;
        dVar66 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
      }
      local_1c8.rot.m_data[2] = local_1c8.rot.m_data[0] * 0.5;
      local_1c8.rot.m_data[0] = 0.5 / local_1c8.rot.m_data[0];
      local_1c8.rot.m_data[3] = (dVar66 + dVar49) * local_1c8.rot.m_data[0];
      local_1c8.rot.m_data[1] = (dVar65 + dVar47) * local_1c8.rot.m_data[0];
      dVar120 = dVar120 - dVar48;
    }
    else {
      dVar66 = ((local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0] - local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[4]) -
               local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8]) + 1.0;
      if (dVar66 < 0.0) {
        local_398 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[5];
        local_1c8.rot.m_data[0] = sqrt(dVar66);
        dVar66 = local_398;
      }
      else {
        auVar95._8_8_ = 0;
        auVar95._0_8_ = dVar66;
        auVar58 = vsqrtsd_avx(auVar95,auVar95);
        local_1c8.rot.m_data[0] = auVar58._0_8_;
        dVar66 = local_258.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
      }
      local_1c8.rot.m_data[1] = local_1c8.rot.m_data[0] * 0.5;
      local_1c8.rot.m_data[0] = 0.5 / local_1c8.rot.m_data[0];
      local_1c8.rot.m_data[2] = (dVar65 + dVar47) * local_1c8.rot.m_data[0];
      local_1c8.rot.m_data[3] = (dVar48 + dVar120) * local_1c8.rot.m_data[0];
      dVar120 = dVar49 - dVar66;
    }
    local_1c8.rot.m_data[0] = dVar120 * local_1c8.rot.m_data[0];
  }
  ChMarker::Impose_Abs_Coord((this->super_ChLinkLock).super_ChLinkMarkers.marker1,&local_1c8);
  local_1c8.pos.m_data[0] = (double)local_2f8._0_8_;
  local_1c8.pos.m_data[1] = local_2d8;
  dVar66 = local_278 + local_1d0 + local_1d8;
  local_1c8.pos.m_data[2] = dVar157;
  if (0.0 <= dVar66) {
    dVar66 = dVar66 + 1.0;
    if (dVar66 < 0.0) {
      local_1c8.rot.m_data[3] = sqrt(dVar66);
    }
    else {
      auVar96._8_8_ = 0;
      auVar96._0_8_ = dVar66;
      auVar58 = vsqrtsd_avx(auVar96,auVar96);
      local_1c8.rot.m_data[3] = auVar58._0_8_;
    }
    local_1c8.rot.m_data[0] = local_1c8.rot.m_data[3] * 0.5;
    local_1c8.rot.m_data[3] = 0.5 / local_1c8.rot.m_data[3];
    local_1c8.rot.m_data[1] = (dVar63 - local_368) * local_1c8.rot.m_data[3];
    local_1c8.rot.m_data[2] = (local_308 - local_358) * local_1c8.rot.m_data[3];
    local_1c8.rot.m_data[3] = ((double)local_388._0_8_ - dVar52) * local_1c8.rot.m_data[3];
  }
  else {
    cVar50 = local_278 < local_1d0;
    dVar157 = local_278;
    if ((bool)cVar50) {
      dVar157 = local_1d0;
    }
    if (dVar157 < local_1d8) {
      cVar50 = '\x02';
    }
    if (cVar50 == '\x02') {
      dVar157 = ((local_1d8 - local_278) - local_1d0) + 1.0;
      if (dVar157 < 0.0) {
        dVar157 = sqrt(dVar157);
      }
      else {
        auVar98._8_8_ = 0;
        auVar98._0_8_ = dVar157;
        auVar58 = vsqrtsd_avx(auVar98,auVar98);
        dVar157 = auVar58._0_8_;
      }
      local_1c8.rot.m_data[3] = dVar157 * 0.5;
      dVar157 = 0.5 / dVar157;
      local_1c8.rot.m_data[1] = (local_308 + local_358) * dVar157;
      local_1c8.rot.m_data[2] = (dVar63 + local_368) * dVar157;
      local_1c8.rot.m_data[0] = (double)local_388._0_8_ - dVar52;
    }
    else if (cVar50 == '\x01') {
      dVar157 = ((local_1d0 - local_1d8) - local_278) + 1.0;
      if (dVar157 < 0.0) {
        dVar157 = sqrt(dVar157);
      }
      else {
        auVar97._8_8_ = 0;
        auVar97._0_8_ = dVar157;
        auVar58 = vsqrtsd_avx(auVar97,auVar97);
        dVar157 = auVar58._0_8_;
      }
      local_1c8.rot.m_data[2] = dVar157 * 0.5;
      dVar157 = 0.5 / dVar157;
      local_1c8.rot.m_data[3] = (local_368 + dVar63) * dVar157;
      local_1c8.rot.m_data[1] = (dVar52 + (double)local_388._0_8_) * dVar157;
      local_1c8.rot.m_data[0] = local_308 - local_358;
    }
    else {
      dVar157 = ((local_278 - local_1d0) - local_1d8) + 1.0;
      if (dVar157 < 0.0) {
        dVar157 = sqrt(dVar157);
      }
      else {
        auVar99._8_8_ = 0;
        auVar99._0_8_ = dVar157;
        auVar58 = vsqrtsd_avx(auVar99,auVar99);
        dVar157 = auVar58._0_8_;
      }
      local_1c8.rot.m_data[1] = dVar157 * 0.5;
      dVar157 = 0.5 / dVar157;
      local_1c8.rot.m_data[2] = (dVar52 + (double)local_388._0_8_) * dVar157;
      local_1c8.rot.m_data[3] = (local_358 + local_308) * dVar157;
      local_1c8.rot.m_data[0] = dVar63 - local_368;
    }
    local_1c8.rot.m_data[0] = local_1c8.rot.m_data[0] * dVar157;
  }
  ChMarker::Impose_Abs_Coord((this->super_ChLinkLock).super_ChLinkMarkers.marker2,&local_1c8);
  return;
}

Assistant:

void ChLinkGear::UpdateTime(double mytime) {
    // First, inherit to parent class
    ChLinkLock::UpdateTime(mytime);

    // Move markers 1 and 2 to align them as gear teeth

    ChVector<> mx;
    ChVector<> my;
    ChVector<> mz;
    ChVector<> mr;
    ChVector<> mmark1;
    ChVector<> mmark2;
    ChVector<> lastX;
    ChVector<> vrota;
    Coordsys newmarkpos;

    ChFrame<double> abs_shaft1;
    ChFrame<double> abs_shaft2;

    ((ChFrame<double>*)Body1)->TransformLocalToParent(local_shaft1, abs_shaft1);
    ((ChFrame<double>*)Body2)->TransformLocalToParent(local_shaft2, abs_shaft2);

    ChVector<> vbdist = Vsub(Get_shaft_pos1(), Get_shaft_pos2());
    ////ChVector<> Trad1 = Vnorm(Vcross(Get_shaft_dir1(), Vnorm(Vcross(Get_shaft_dir1(), vbdist))));
    ////ChVector<> Trad2 = Vnorm(Vcross(Vnorm(Vcross(Get_shaft_dir2(), vbdist)), Get_shaft_dir2()));

    double dist = Vlength(vbdist);

    // compute actual rotation of the two wheels (relative to truss).
    ChVector<> md1 = abs_shaft1.GetA().transpose() * (-vbdist);
    md1.z() = 0;
    md1 = Vnorm(md1);
    ChVector<> md2 = abs_shaft2.GetA().transpose() * (-vbdist);
    md2.z() = 0;
    md2 = Vnorm(md2);

    double periodic_a1 = ChAtan2(md1.x(), md1.y());
    double periodic_a2 = ChAtan2(md2.x(), md2.y());
    double old_a1 = a1;
    double old_a2 = a2;
    double turns_a1 = floor(old_a1 / CH_C_2PI);
    double turns_a2 = floor(old_a2 / CH_C_2PI);
    double a1U = turns_a1 * CH_C_2PI + periodic_a1 + CH_C_2PI;
    double a1M = turns_a1 * CH_C_2PI + periodic_a1;
    double a1L = turns_a1 * CH_C_2PI + periodic_a1 - CH_C_2PI;
    a1 = a1M;
    if (fabs(a1U - old_a1) < fabs(a1M - old_a1))
        a1 = a1U;
    if (fabs(a1L - a1) < fabs(a1M - a1))
        a1 = a1L;
    double a2U = turns_a2 * CH_C_2PI + periodic_a2 + CH_C_2PI;
    double a2M = turns_a2 * CH_C_2PI + periodic_a2;
    double a2L = turns_a2 * CH_C_2PI + periodic_a2 - CH_C_2PI;
    a2 = a2M;
    if (fabs(a2U - old_a2) < fabs(a2M - old_a2))
        a2 = a2U;
    if (fabs(a2L - a2) < fabs(a2M - a2))
        a2 = a2L;

    // compute new markers coordsystem alignment
    my = Vnorm(vbdist);
    mz = Get_shaft_dir1();
    mx = Vnorm(Vcross(my, mz));
    mr = Vnorm(Vcross(mz, mx));
    mz = Vnorm(Vcross(mx, my));
    ChVector<> mz2, mx2, mr2, my2;
    my2 = my;
    mz2 = Get_shaft_dir2();
    mx2 = Vnorm(Vcross(my2, mz2));
    mr2 = Vnorm(Vcross(mz2, mx2));

    ChMatrix33<> ma1(mx, my, mz);

    // rotate csys because of beta
    vrota.x() = 0.0;
    vrota.y() = beta;
    vrota.z() = 0.0;
    ChMatrix33<> mrotma;
    mrotma.Set_A_Rxyz(vrota);
    ChMatrix33<> marot_beta = ma1 * mrotma;
    // rotate csys because of alpha
    vrota.x() = 0.0;
    vrota.y() = 0.0;
    vrota.z() = alpha;
    if (react_force.x() < 0)
        vrota.z() = alpha;
    else
        vrota.z() = -alpha;
    mrotma.Set_A_Rxyz(vrota);
    ma1 = marot_beta * mrotma;

    ChMatrix33<> ma2 = ma1;

    // is a bevel gear?
    double be = acos(Vdot(Get_shaft_dir1(), Get_shaft_dir2()));
    bool is_bevel = true;
    if (fabs(Vdot(Get_shaft_dir1(), Get_shaft_dir2())) > 0.96)
        is_bevel = false;

    // compute wheel radii so that:
    //            w2 = - tau * w1
    if (!is_bevel) {
        double pardist = Vdot(mr, vbdist);
        double inv_tau = 1.0 / tau;
        if (!epicyclic) {
            r2 = pardist - pardist / (inv_tau + 1.0);
        } else {
            r2 = pardist - (tau * pardist) / (tau - 1.0);
        }
        r1 = r2 * tau;
    } else {
        double gamma2;
        if (!epicyclic) {
            gamma2 = be / (tau + 1.0);
        } else {
            gamma2 = be / (-tau + 1.0);
        }
        double al = CH_C_PI - acos(Vdot(Get_shaft_dir2(), my));
        double te = CH_C_PI - al - be;
        double fd = sin(te) * (dist / sin(be));
        r2 = fd * tan(gamma2);
        r1 = r2 * tau;
    }

    // compute markers positions, supposing they
    // stay on the ideal wheel contact point
    mmark1 = Vadd(Get_shaft_pos2(), Vmul(mr2, r2));
    mmark2 = mmark1;
    contact_pt = mmark1;

    // correct marker 1 position if phasing is not correct
    if (checkphase) {
        double realtau = tau;
        if (epicyclic)
            realtau = -tau;
        double m_delta;
        m_delta = -(a2 / realtau) - a1 - phase;

        if (m_delta > CH_C_PI)
            m_delta -= (CH_C_2PI);  // range -180..+180 is better than 0...360
        if (m_delta > (CH_C_PI / 4.0))
            m_delta = (CH_C_PI / 4.0);  // phase correction only in +/- 45�
        if (m_delta < -(CH_C_PI / 4.0))
            m_delta = -(CH_C_PI / 4.0);

        vrota.x() = vrota.y() = 0.0;
        vrota.z() = -m_delta;
        mrotma.Set_A_Rxyz(vrota);  // rotate about Z of shaft to correct
        mmark1 = abs_shaft1.GetA().transpose() * (mmark1 - Get_shaft_pos1());
        mmark1 = mrotma * mmark1;
        mmark1 = abs_shaft1.GetA() * mmark1 + Get_shaft_pos1();
    }
    // Move Shaft 1 along its direction if not aligned to wheel
    double offset = Vdot(Get_shaft_dir1(), (contact_pt - Get_shaft_pos1()));
    ChVector<> moff = Get_shaft_dir1() * offset;
    if (fabs(offset) > 0.0001)
        local_shaft1.SetPos(local_shaft1.GetPos() + Body1->TransformDirectionParentToLocal(moff));

    // ! Require that the BDF routine of marker won't handle speed and acc.calculus of the moved marker 2!
    marker2->SetMotionType(ChMarker::M_MOTION_EXTERNAL);
    marker1->SetMotionType(ChMarker::M_MOTION_EXTERNAL);

    // move marker1 in proper positions
    newmarkpos.pos = mmark1;
    newmarkpos.rot = ma1.Get_A_quaternion();
    marker1->Impose_Abs_Coord(newmarkpos);  // move marker1 into teeth position
    // move marker2 in proper positions
    newmarkpos.pos = mmark2;
    newmarkpos.rot = ma2.Get_A_quaternion();
    marker2->Impose_Abs_Coord(newmarkpos);  // move marker2 into teeth position
}